

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_libc_load_file_into_buffer(void *user_data,char *filename,void *dst,rf_int dst_size)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  size_t sVar4;
  int no_error;
  int read_size;
  int file_size;
  FILE *file;
  _Bool result;
  rf_int dst_size_local;
  void *dst_local;
  char *filename_local;
  void *user_data_local;
  
  file._7_1_ = false;
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    lVar3 = ftell(__stream);
    iVar1 = (int)lVar3;
    fseek(__stream,0,0);
    if (iVar1 <= dst_size) {
      sVar4 = fread(dst,1,(long)iVar1,__stream);
      iVar2 = ferror(__stream);
      if ((iVar2 == 0) && ((int)sVar4 == iVar1)) {
        file._7_1_ = true;
      }
    }
  }
  fclose(__stream);
  return file._7_1_;
}

Assistant:

RF_API bool rf_libc_load_file_into_buffer(void* user_data, const char* filename, void* dst, rf_int dst_size)
{
    ((void)user_data);
    bool result = false;

    FILE* file = fopen(filename, "rb");
    if (file != NULL)
    {
        fseek(file, 0L, SEEK_END);
        int file_size = ftell(file);
        fseek(file, 0L, SEEK_SET);

        if (dst_size >= file_size)
        {
            int read_size = fread(dst, 1, file_size, file);
            int no_error = ferror(file) == 0;
            if (no_error && read_size == file_size)
            {
                result = true;
            }
        }
        // else log_error buffer is not big enough
    }
    // else log error could not open file

    fclose(file);

    return result;
}